

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  char *pcVar1;
  luaL_Buffer b;
  luaL_Buffer local_448;
  
  local_448.b = (char *)&local_448.init;
  local_448.n = 0;
  local_448.size = 0x400;
  local_448.L = L;
  lua_pushlightuserdata(L,&local_448);
  luaL_addgsub(&local_448,s,p,r);
  luaL_pushresult(&local_448);
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar1;
}

Assistant:

LUALIB_API const char *luaL_gsub (lua_State *L, const char *s,
                                  const char *p, const char *r) {
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  luaL_addgsub(&b, s, p, r);
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}